

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O2

uint __thiscall yactfr::internal::TsdlAttr::align(TsdlAttr *this)

{
  ulong uVar1;
  string msg;
  ostream *poVar2;
  undefined8 in_stack_fffffffffffffe40;
  TextLocation in_stack_fffffffffffffe48;
  TextLocation local_1a0;
  ostringstream ss;
  
  checkKind(this,UInt);
  uVar1 = this->uintVal;
  if (uVar1 - 1 < (uVar1 ^ uVar1 - 1)) {
    return (uint)uVar1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar2 = std::operator<<((ostream *)&ss,"Invalid `align` attribute (must be a power of two): ");
  poVar2 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar2);
  std::operator<<(poVar2,".");
  std::__cxx11::stringbuf::str();
  valTextLoc(&local_1a0,this);
  msg._M_string_length = local_1a0._lineNumber;
  msg._M_dataplus._M_p = (pointer)local_1a0._offset;
  msg.field_2._M_allocated_capacity = local_1a0._colNumber;
  msg.field_2._8_8_ = in_stack_fffffffffffffe40;
  throwTextParseError(msg,in_stack_fffffffffffffe48);
}

Assistant:

unsigned int TsdlAttr::align() const
{
    this->checkKind(Kind::UInt);

    if (!isPowOfTwo(uintVal)) {
        std::ostringstream ss;

        ss << "Invalid `align` attribute (must be a power of two): " << uintVal << ".";
        throwTextParseError(ss.str(), this->valTextLoc());
    }

    return uintVal;
}